

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constrain.cpp
# Opt level: O2

void __thiscall CaDiCaL::Internal::constrain(Internal *this,int lit)

{
  char cVar1;
  uint uVar2;
  uint *puVar3;
  pointer pcVar4;
  uint *puVar5;
  int *piVar6;
  uint uVar7;
  int *lit_1;
  uint *puVar8;
  char cVar9;
  iterator __begin4;
  int *piVar10;
  uint *puVar11;
  int local_2c;
  
  local_2c = lit;
  if (lit == 0) {
    if (this->level != 0) {
      backtrack(this,0);
    }
    puVar3 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    puVar8 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
    for (puVar11 = puVar8; puVar11 != puVar3; puVar11 = puVar11 + 1) {
      uVar2 = *puVar11;
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      pcVar4 = (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      cVar1 = pcVar4[uVar7];
      cVar9 = -cVar1;
      if (-1 < (long)(int)uVar2) {
        cVar9 = cVar1;
      }
      if (cVar9 < '\x01') {
        if (cVar9 < '\0') break;
        if (-1 < this->vals[(int)uVar2]) {
          if (this->vals[(int)uVar2] != '\0') break;
          *puVar8 = uVar2;
          puVar8 = puVar8 + 1;
          uVar2 = *puVar11;
          uVar7 = -uVar2;
          if (0 < (int)uVar2) {
            uVar7 = uVar2;
          }
          pcVar4[uVar7] = uVar2 != 0 | (byte)((int)uVar2 >> 0x1f);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::resize
              (&this->constraint,
               (long)puVar8 -
               (long)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start >> 2);
    puVar5 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish;
    for (puVar8 = (uint *)(this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start; puVar8 != puVar5; puVar8 = puVar8 + 1) {
      uVar2 = *puVar8;
      uVar7 = -uVar2;
      if (0 < (int)uVar2) {
        uVar7 = uVar2;
      }
      (this->marks).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar7] = '\0';
    }
    piVar10 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar6 = (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar11 == puVar3) {
      if (piVar10 == piVar6) {
        this->unsat_constraint = true;
        if (this->conflict_id == 0) {
          this->marked_failed = false;
        }
      }
      else {
        for (; piVar10 != piVar6; piVar10 = piVar10 + 1) {
          freeze(this,*piVar10);
        }
      }
    }
    else if (piVar6 != piVar10) {
      (this->constraint).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar10;
    }
  }
  else {
    std::vector<int,_std::allocator<int>_>::push_back(&this->constraint,&local_2c);
  }
  return;
}

Assistant:

void Internal::constrain (int lit) {
  if (lit)
    constraint.push_back (lit);
  else {
    if (level)
      backtrack ();
    LOG (constraint, "shrinking constraint");
    bool satisfied_constraint = false;
    const vector<int>::const_iterator end = constraint.end ();
    vector<int>::iterator i = constraint.begin ();
    for (vector<int>::const_iterator j = i; j != end; j++) {
      int tmp = marked (*j);
      if (tmp > 0) {
        LOG ("removing duplicated literal %d from constraint", *j);
      } else if (tmp < 0) {
        LOG ("tautological since both %d and %d occur in constraint", -*j,
             *j);
        satisfied_constraint = true;
        break;
      } else {
        tmp = val (*j);
        if (tmp < 0) {
          LOG ("removing falsified literal %d from constraint clause", *j);
        } else if (tmp > 0) {
          LOG ("satisfied constraint with literal %d", *j);
          satisfied_constraint = true;
          break;
        } else {
          *i++ = *j;
          mark (*j);
        }
      }
    }
    constraint.resize (i - constraint.begin ());
    for (const auto &lit : constraint)
      unmark (lit);
    if (satisfied_constraint)
      constraint.clear ();
    else if (constraint.empty ()) {
      unsat_constraint = true;
      if (!conflict_id)
        marked_failed = false; // allow to trigger failing ()
    } else
      for (const auto lit : constraint)
        freeze (lit);
  }
}